

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

string * __thiscall
czh::value::details::get_typename_abi_cxx11_(string *__return_storage_ptr__,details *this,size_t sz)

{
  int iVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_129;
  allocator<char> local_128;
  allocator<char> local_127;
  allocator<char> local_126;
  allocator<char> local_125;
  allocator<char> local_124;
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  if (get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Null",&local_121);
      std::__cxx11::string::string<std::allocator<char>>(local_100,"int",&local_122);
      std::__cxx11::string::string<std::allocator<char>>(local_e0,"long long",&local_123);
      std::__cxx11::string::string<std::allocator<char>>(local_c0,"double",&local_124);
      std::__cxx11::string::string<std::allocator<char>>(local_a0,"bool",&local_125);
      std::__cxx11::string::string<std::allocator<char>>(local_80,"std::string",&local_126);
      std::__cxx11::string::string<std::allocator<char>>
                (local_60,"czh::value::Reference",&local_127);
      std::__cxx11::string::string<std::allocator<char>>(local_40,"czh::value::Array",&local_128);
      __l._M_len = 8;
      __l._M_array = &local_120;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_,__l,&local_129);
      lVar2 = 0xe0;
      do {
        std::__cxx11::string::~string((string *)((long)&local_120._M_dataplus._M_p + lVar2));
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -0x20);
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,&get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_);
    }
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             get_typename[abi:cxx11](unsigned_long)::names_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + (long)this);
  return __return_storage_ptr__;
}

Assistant:

std::string get_typename(size_t sz)
      {
        static std::vector<std::string>
            names{"Null", "int", "long long", "double", "bool", "std::string", "czh::value::Reference",
                  "czh::value::Array"};
        return names[sz];
      }